

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O2

string * __thiscall
lscpp::stdio_transporter::read_message_abi_cxx11_
          (string *__return_storage_ptr__,stdio_transporter *this,size_t length)

{
  char *pcVar1;
  size_t in_RCX;
  int __fd;
  
  reserve(this,length);
  read(0,(this->data_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl,length);
  if ((this->comm_logger_).super__Optional_base<lscpp::comm_logger,_false,_false>._M_payload.
      super__Optional_payload<lscpp::comm_logger,_true,_false,_false>.
      super__Optional_payload_base<lscpp::comm_logger>._M_engaged == true) {
    pcVar1 = (this->data_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
    comm_logger::open_in((comm_logger *)this);
    __fd = (int)pcVar1;
    comm_logger::write((comm_logger *)this,__fd,(void *)length,in_RCX);
    comm_logger::close((comm_logger *)this,__fd);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append
            ((char *)__return_storage_ptr__,
             (ulong)(this->data_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                    _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                    super__Head_base<0UL,_char_*,_false>._M_head_impl);
  return __return_storage_ptr__;
}

Assistant:

std::string stdio_transporter::read_message(std::size_t length) {
  reserve(length);
  ::read(stdin_fileno, data_.get(), length);

  log_in_message(comm_logger_, data_.get(), length);

  std::string res;
  res.append(data_.get(), length);
  return res;
}